

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comment.h
# Opt level: O1

void __thiscall Comment::Comment(Comment *this,Comment *param_1)

{
  pointer pcVar1;
  
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  pcVar1 = (param_1->id)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->id)._M_string_length);
  (this->parentId)._M_dataplus._M_p = (pointer)&(this->parentId).field_2;
  pcVar1 = (param_1->parentId)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->parentId,pcVar1,pcVar1 + (param_1->parentId)._M_string_length);
  (this->threadId)._M_dataplus._M_p = (pointer)&(this->threadId).field_2;
  pcVar1 = (param_1->threadId)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->threadId,pcVar1,pcVar1 + (param_1->threadId)._M_string_length);
  (this->body)._M_dataplus._M_p = (pointer)&(this->body).field_2;
  pcVar1 = (param_1->body)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->body,pcVar1,pcVar1 + (param_1->body)._M_string_length);
  (this->author)._M_dataplus._M_p = (pointer)&(this->author).field_2;
  pcVar1 = (param_1->author)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->author,pcVar1,pcVar1 + (param_1->author)._M_string_length);
  (this->fullName)._M_dataplus._M_p = (pointer)&(this->fullName).field_2;
  pcVar1 = (param_1->fullName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->fullName,pcVar1,pcVar1 + (param_1->fullName)._M_string_length);
  (this->link)._M_dataplus._M_p = (pointer)&(this->link).field_2;
  pcVar1 = (param_1->link)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->link,pcVar1,pcVar1 + (param_1->link)._M_string_length);
  this->isTopLevelComment = param_1->isTopLevelComment;
  this->created = param_1->created;
  return;
}

Assistant:

Comment(const Json& json) {
			id = json["id"].get<std::string>();

			body = replaceHtmlSymbols(json["body"].get<std::string>());
			str::replace_all(body, "\\_", "_");

			author = json["author"].get<std::string>();

			created = json["created"].get<size_t>();

			fullName = json["name"].get<std::string>();

			link = "https://www.reddit.com" + json["permalink"].get<std::string>();

			const std::string parentId_entry = json["parent_id"].get<std::string>();
			parentId = parentId_entry.substr(3); // t1_[...], t3_[...]
			isTopLevelComment = str::starts_with(parentId_entry, "t3_");

			const std::string threadId_entry = json["link_id"].get<std::string>();
			threadId = threadId_entry.substr(3); // t3_[...]
		}